

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O0

void __thiscall MinVR::VRDataIndex::VRDataIndex(VRDataIndex *this,string *serializedData)

{
  char *pcVar1;
  Cxml *pCVar2;
  element *this_00;
  element *__s;
  element *__a;
  string *in_RSI;
  long in_RDI;
  VRDataIndex *in_stack_00000070;
  string out;
  element *grandChild;
  element *child;
  element *xml_node;
  Cxml *xml;
  string *in_stack_000003f8;
  element *in_stack_00000400;
  VRDataIndex *in_stack_00000408;
  VRDataIndex *in_stack_00000570;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
  *in_stack_fffffffffffffe98;
  element *in_stack_fffffffffffffea0;
  Cxml *in_stack_fffffffffffffeb0;
  element *in_stack_fffffffffffffeb8;
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  allocator<char> local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  element *local_70;
  element *local_68;
  element *local_60;
  string local_58 [32];
  Cxml *local_38;
  _Base_ptr local_30;
  allocator<char> local_11 [17];
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
         *)0x10a396);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                       *)(in_RDI + 0x30));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<char>::~allocator(local_11);
  *(undefined4 *)(in_RDI + 0x58) = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x10a40f);
  *(undefined1 *)(in_RDI + 0x90) = 0;
  local_30 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
             ::end(in_stack_fffffffffffffe98);
  *(_Base_ptr *)(in_RDI + 0x30) = local_30;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  if (*pcVar1 == '<') {
    pCVar2 = (Cxml *)operator_new(0x10);
    Cxml::Cxml(in_stack_fffffffffffffeb0);
    local_38 = pCVar2;
    std::__cxx11::string::string(local_58,in_RSI);
    Cxml::parse_string(pCVar2,in_stack_fffffffffffffee0);
    std::__cxx11::string::~string(local_58);
    this_00 = Cxml::get_root_element(local_38);
    local_60 = this_00;
    __s = element::get_next_child(in_stack_fffffffffffffeb8);
    local_68 = __s;
    __a = element::get_next_child(in_stack_fffffffffffffeb8);
    local_70 = __a;
    std::__cxx11::string::string(local_90);
    while (local_68 != (element *)0x0) {
      pcVar1 = element::get_name(local_68);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x38),pcVar1);
      while (local_70 != (element *)0x0) {
        in_stack_fffffffffffffeb8 = local_70;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   (char *)__s,(allocator<char> *)__a);
        _walkXML(in_stack_00000408,in_stack_00000400,in_stack_000003f8);
        std::__cxx11::string::operator=(local_90,local_b0);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator(&local_d1);
        local_70 = element::get_next_child(in_stack_fffffffffffffeb8);
      }
      in_stack_fffffffffffffea0 = element::get_next_child(in_stack_fffffffffffffeb8);
      local_68 = in_stack_fffffffffffffea0;
    }
    if (local_38 != (Cxml *)0x0) {
      pCVar2 = local_38;
      Cxml::~Cxml((Cxml *)in_stack_fffffffffffffea0);
      operator_delete(pCVar2,0x10);
    }
    if ((*(byte *)(in_RDI + 0x90) & 1) != 0) {
      _linkNodes(in_stack_00000070);
      _linkContent(in_stack_00000570);
      *(undefined1 *)(in_RDI + 0x90) = 0;
    }
    std::__cxx11::string::~string(local_90);
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x38),in_RSI);
  }
  return;
}

Assistant:

VRDataIndex::VRDataIndex(const std::string serializedData)  :
  _indexName("MVR"), _overwrite(1), _linkNeeded(false) {

  _lastDatum = _theIndex.end();

  // If this is just a name, we just need an empty data index with the
  // given name.
  if (serializedData[0] != '<') {
    _indexName = serializedData;
    return;
  }

  // If you're here, the input data looks like XML. So parse it.
  Cxml *xml = new Cxml();
  xml->parse_string(serializedData);
  element *xml_node = xml->get_root_element();
  element* child = xml_node->get_next_child();
  element* grandChild = child->get_next_child();
  std::string out;

  // If we have been given data from a valid XML file (which has only
  // one root element), the 'child' points to the root node, which we
  // don't want to keep.  So we'll work our way through the
  // grandchildren in this loop.
  while (child != NULL) {

    // There should be only one child here, so this should only pick
    // the root name off the serial data.
    _indexName = child->get_name();

    // Now scan through the child's children for the rest of the data.
    while (grandChild != NULL) {

      out = _walkXML(grandChild, "/");

      grandChild = child->get_next_child();
    }

    child = xml_node->get_next_child();
  }

  delete xml;

  // If there are nodes in the tree with a 'linknode' attribute,
  // resolve them.
  if (_linkNeeded) {
    _linkNodes();
    _linkContent();
    _linkNeeded = false;
  }

}